

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::PresetVectorIntHelper
               (vector<int,_std::allocator<int>_> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)::
      helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_38[1] = (code *)0x0;
      local_38[0] = cmCMakePresetsErrors::INVALID_PRESET;
      local_20 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::
      VectorFilter<int,bool(*)(int&,Json::Value_const*,cmJSONState*),cmJSONHelperBuilder::Vector<int,bool(*)(int&,Json::Value_const*,cmJSONState*)>(std::function<void(Json::Value_const*,cmJSONState*)>,bool(*)(int&,Json::Value_const*,cmJSONState*))::_lambda(int_const&)_1_>
                (&PresetVectorIntHelper::helper,(cmJSONHelperBuilder *)local_38,PresetIntHelper);
      std::_Function_base::~_Function_base((_Function_base *)local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetVectorIntHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetVectorIntHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool PresetVectorIntHelper(std::vector<int>& out, const Json::Value* value,
                           cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    cmCMakePresetsErrors::INVALID_PRESET, PresetIntHelper);
  return helper(out, value, state);
}